

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspsubrs.c
# Opt level: O0

void flip_cursor(void)

{
  int local_14;
  DLword *pDStack_10;
  int cnt;
  DLword *word;
  
  pDStack_10 = EmCursorBitMap68K;
  local_14 = 0x10;
  while (local_14 != 0) {
    *(ushort *)((ulong)pDStack_10 ^ 2) = *(ushort *)((ulong)pDStack_10 ^ 2) ^ 0xffff;
    local_14 = local_14 + -1;
    pDStack_10 = pDStack_10 + 1;
  }
  Set_XCursor(Current_Hot_X,0xf - Current_Hot_Y);
  return;
}

Assistant:

void flip_cursor(void) {
  DLword *word;
  int cnt;
  extern int ScreenLocked;
  extern DLword *EmCursorX68K, *EmCursorY68K;

  word = EmCursorBitMap68K;

#ifdef INIT

  /* since this is called frequently, and you don't want to have
     to build a different LDE to run the 2 parts of a Loadup, there is
     an ifdef AND a test.  This way we don't generate
     extra code for anybody else building an LDE
     except those who want to try building loadups.  */

  if (!for_makeinit) {
    for (cnt = CURSORHEIGHT; (cnt--);) { GETWORD(word++) ^= 0xFFFF; }
  }

#else

  for (cnt = CURSORHEIGHT; (cnt--);) { GETWORD(word++) ^= 0xFFFF; }

#endif


#if defined(XWINDOW)
  /* JDS 011213: 15- cur y, as function does same! */
  Set_XCursor(Current_Hot_X, 15 - Current_Hot_Y);
#elif defined(SDL)
  sdl_setCursor(0, 0); // TODO: keep track of the current hot_x and hot_y
#endif /* XWINDOW */
}